

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

void __thiscall asmjit::CodeBuilder::removeNodes(CodeBuilder *this,CBNode *first,CBNode *last)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar5;
  CBNode *next_1;
  CBNode *node;
  CBNode *next;
  CBNode *prev;
  CBJump *current;
  CBJump **pPrev;
  CBLabel *label;
  CBJump *node_1;
  char *in_stack_00000350;
  int in_stack_0000035c;
  char *in_stack_00000360;
  CBNode *in_stack_ffffffffffffff68;
  CodeBuilder *in_stack_ffffffffffffff70;
  long *local_60;
  
  if (in_RSI == in_RDX) {
    removeNode(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    lVar1 = *in_RSI;
    plVar2 = (long *)in_RDX[1];
    if (*(long **)(in_RDI + 0x168) == in_RSI) {
      *(long **)(in_RDI + 0x168) = plVar2;
    }
    else {
      *(long **)(lVar1 + 8) = plVar2;
    }
    if (*(long **)(in_RDI + 0x170) == in_RDX) {
      *(long *)(in_RDI + 0x170) = lVar1;
    }
    else {
      *plVar2 = lVar1;
    }
    do {
      plVar2 = (long *)in_RSI[1];
      if (plVar2 == (long *)0x0) {
        DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
      }
      *in_RSI = 0;
      in_RSI[1] = 0;
      if (*(long **)(in_RDI + 0x178) == in_RSI) {
        *(long *)(in_RDI + 0x178) = lVar1;
      }
      if (((*(ushort *)((long)in_RSI + 0x12) & 0x30) != 0) && (lVar3 = in_RSI[9], lVar3 != 0)) {
        local_60 = (long *)(lVar3 + 0x30);
        while( true ) {
          if (*local_60 == 0) {
            DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
          }
          plVar4 = (long *)*local_60;
          if (plVar4 == (long *)0x0) goto LAB_001f0b2b;
          if (plVar4 == in_RSI) break;
          local_60 = plVar4 + 10;
        }
        *local_60 = in_RSI[10];
LAB_001f0b2b:
        *(int *)(lVar3 + 0x2c) = *(int *)(lVar3 + 0x2c) + -1;
      }
      bVar5 = in_RSI != in_RDX;
      in_RSI = plVar2;
    } while (bVar5);
  }
  return;
}

Assistant:

void CodeBuilder::removeNodes(CBNode* first, CBNode* last) noexcept {
  if (first == last) {
    removeNode(first);
    return;
  }

  CBNode* prev = first->_prev;
  CBNode* next = last->_next;

  if (_firstNode == first)
    _firstNode = next;
  else
    prev->_next = next;

  if (_lastNode == last)
    _lastNode  = prev;
  else
    next->_prev = prev;

  CBNode* node = first;
  for (;;) {
    CBNode* next = node->getNext();
    ASMJIT_ASSERT(next != nullptr);

    node->_prev = nullptr;
    node->_next = nullptr;

    if (_cursor == node)
      _cursor = prev;
    CodeBuilder_nodeRemoved(this, node);

    if (node == last)
      break;
    node = next;
  }
}